

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::MergeFrom
          (GeneratedCodeInfo_Annotation *this,GeneratedCodeInfo_Annotation *from)

{
  uint uVar1;
  RepeatedField<int> *in_RSI;
  GeneratedCodeInfo_Annotation *in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_ffffffffffffff08;
  void **this_00;
  string *in_stack_ffffffffffffff28;
  RepeatedField<int> *in_stack_ffffffffffffff88;
  
  this_00 = &in_RSI->arena_or_elements_;
  if (((uint)*this_00 & 1) == 1) {
    if (((uint)*this_00 & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)this_00,in_stack_ffffffffffffff08);
  }
  RepeatedField<int>::MergeFrom(in_RSI,in_stack_ffffffffffffff88);
  uVar1 = in_RSI[1].current_size_;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_source_file_abi_cxx11_((GeneratedCodeInfo_Annotation *)0x531849);
      _internal_set_source_file(in_RDI,in_stack_ffffffffffffff28);
    }
    if ((uVar1 & 2) != 0) {
      in_RDI->begin_ = *(int32 *)&in_RSI[3].arena_or_elements_;
    }
    if ((uVar1 & 4) != 0) {
      in_RDI->end_ = *(int32 *)((long)&in_RSI[3].arena_or_elements_ + 4);
    }
    (in_RDI->_has_bits_).has_bits_[0] = uVar1 | (in_RDI->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void GeneratedCodeInfo_Annotation::MergeFrom(const GeneratedCodeInfo_Annotation& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.GeneratedCodeInfo.Annotation)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  path_.MergeFrom(from.path_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_source_file(from._internal_source_file());
    }
    if (cached_has_bits & 0x00000002u) {
      begin_ = from.begin_;
    }
    if (cached_has_bits & 0x00000004u) {
      end_ = from.end_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}